

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong uVar13;
  int iVar14;
  char buffer [32];
  
  pcVar5 = args->p;
  iVar14 = args->len;
  args->len = 0;
  s->start = pcVar5;
  pcVar12 = pcVar5;
  do {
    iVar10 = (int)pcVar12 - iVar14;
    while( true ) {
      iVar10 = iVar10 + 1;
      if (pcVar5 + iVar14 <= pcVar12) {
        if (args->chunked == 0) {
          return 0;
        }
        if ((args->final != 0) && (args->max_len <= args->len + 7)) {
          return -1;
        }
        uVar3 = sprintf(buffer,"%X\r\n");
        pcVar5 = args->p;
        lVar8 = (long)(int)uVar3;
        args->p = pcVar5 + -lVar8;
        memcpy(pcVar5 + -lVar8,buffer,(ulong)uVar3);
        iVar14 = args->len;
        lVar6 = iVar14 + lVar8;
        args->len = (int)lVar6;
        iVar10 = args->final;
        pcVar5 = args->p;
        pcVar5[lVar6] = '\r';
        if (iVar10 == 0) {
          pcVar5[lVar6 + 1] = '\n';
          args->len = args->len + 2;
          return 0;
        }
        builtin_strncpy(pcVar5 + iVar14 + lVar8 + 1,"\n0\r\n\r\n",6);
        args->len = args->len + 7;
        return 0;
      }
      if (args->max_len <= args->len + 7) {
        _lws_log(1,"Used up interpret padding\n");
        return -1;
      }
      iVar11 = s->pos;
      if ((long)iVar11 != 0) goto LAB_00120005;
      if (*pcVar12 == '$') break;
      args->len = args->len + 1;
      pcVar12 = pcVar12 + 1;
    }
    s->start = pcVar12;
LAB_00120005:
    cVar1 = *pcVar12;
    s->pos = iVar11 + 1;
    s->swallow[iVar11] = cVar1;
    uVar3 = s->pos;
    if ((ulong)uVar3 == 0xf) {
LAB_00120126:
      s->swallow[(int)uVar3] = '\0';
      memcpy(s->start,s->swallow,(ulong)(uint)s->pos);
      args->len = args->len + 1;
      s->pos = 0;
      pcVar12 = s->start;
    }
    else {
      uVar7 = 0;
      uVar13 = (ulong)(uint)s->count_vars;
      if (s->count_vars < 1) {
        uVar13 = uVar7;
      }
      iVar11 = 0;
      uVar9 = 0;
      for (; uVar13 != uVar7; uVar7 = uVar7 + 1) {
        iVar2 = strncmp(s->swallow,s->vars[uVar7],(ulong)uVar3);
        if (iVar2 == 0) {
          uVar9 = uVar7 & 0xffffffff;
        }
        iVar11 = iVar11 + (uint)(iVar2 == 0);
      }
      if (iVar11 == 0) goto LAB_00120126;
      if (iVar11 == 1) {
        sVar4 = strlen(s->vars[(int)uVar9]);
        if (uVar3 == (uint)sVar4) {
          pcVar5 = (*s->replace)(s->data,(int)uVar9);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = "NULL";
          }
          sVar4 = strlen(pcVar5);
          s->swallow[s->pos] = '\0';
          iVar11 = (int)sVar4;
          if (s->pos != iVar11) {
            memmove(s->start + iVar11,s->start + s->pos,(ulong)(uint)(*(int *)&args->p - iVar10));
            iVar14 = ((iVar14 + iVar11) - s->pos) + 1;
          }
          memcpy(s->start,pcVar5,sVar4 & 0xffffffff);
          args->len = args->len + 1;
          pcVar12 = s->start + 1;
          s->pos = 0;
        }
      }
    }
    pcVar12 = pcVar12 + 1;
    pcVar5 = args->p;
  } while( true );
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], (unsigned int)s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, (unsigned int)s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						(unsigned int)(old_len - (sp - args->p) - 1));
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, (unsigned int)n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, (unsigned int)n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}